

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::CMP_AB_Y(CPU *this)

{
  byte bVar1;
  uint16_t uVar2;
  byte bVar3;
  
  this->cycles = 4;
  uVar2 = GetWord(this);
  bVar1 = ReadByte(this,this->Y + uVar2);
  bVar3 = this->A - bVar1;
  (this->field_6).ps =
       bVar3 & 0x80 | (bVar3 == 0) * '\x02' | bVar1 <= this->A | (this->field_6).ps & 0x7c;
  return;
}

Assistant:

void CPU::CMP_AB_Y()
{
    cycles = 4;
    uint8_t op = ReadByte(GetWord() + Y);
    uint8_t res = A - op;
    C = (A >= op);
    Z = (A == op);
    N = (res & 0b10000000) > 0;
}